

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getChannelMantissaBitDepth(tcu *this,ChannelType channelType)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  IVec4 IVar2;
  ChannelType channelType_local;
  undefined8 uVar1;
  
  switch(channelType) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case UNSIGNED_BYTE_44:
  case UNSIGNED_SHORT_565:
  case UNSIGNED_SHORT_4444:
  case UNSIGNED_SHORT_5551:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
  case UNSIGNED_INT_999_E5_REV:
  case UNSIGNED_INT_16_8_8:
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
  case SIGNED_INT8:
  case SIGNED_INT16:
  case SIGNED_INT32:
  case UNSIGNED_INT8:
  case UNSIGNED_INT16:
  case UNSIGNED_INT24:
  case UNSIGNED_INT32:
    IVar2 = getChannelBitDepth(this,channelType);
    uVar1 = IVar2.m_data._8_8_;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,6,6,5,0);
    uVar1 = extraout_RDX_02;
    break;
  case HALF_FLOAT:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10);
    uVar1 = extraout_RDX;
    break;
  case FLOAT:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x17);
    uVar1 = extraout_RDX_00;
    break;
  case FLOAT64:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x34);
    uVar1 = extraout_RDX_01;
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x17,8,0,0);
    uVar1 = extraout_RDX_03;
    break;
  default:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0);
    uVar1 = extraout_RDX_04;
  }
  IVar2.m_data[2] = (int)uVar1;
  IVar2.m_data[3] = (int)((ulong)uVar1 >> 0x20);
  IVar2.m_data._0_8_ = this;
  return (IVec4)IVar2.m_data;
}

Assistant:

static IVec4 getChannelMantissaBitDepth (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:
		case TextureFormat::SNORM_INT16:
		case TextureFormat::SNORM_INT32:
		case TextureFormat::UNORM_INT8:
		case TextureFormat::UNORM_INT16:
		case TextureFormat::UNORM_INT24:
		case TextureFormat::UNORM_INT32:
		case TextureFormat::UNORM_BYTE_44:
		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNORM_SHORT_555:
		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNORM_SHORT_1555:
		case TextureFormat::UNSIGNED_BYTE_44:
		case TextureFormat::UNSIGNED_SHORT_565:
		case TextureFormat::UNSIGNED_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_5551:
		case TextureFormat::UNORM_INT_101010:
		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT24:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::SIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_16_8_8:
		case TextureFormat::UNSIGNED_INT_24_8:
		case TextureFormat::UNSIGNED_INT_24_8_REV:
		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			return getChannelBitDepth(channelType);

		case TextureFormat::HALF_FLOAT:						return IVec4(10);
		case TextureFormat::FLOAT:							return IVec4(23);
		case TextureFormat::FLOAT64:						return IVec4(52);
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return IVec4(6,6,5,0);
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return IVec4(23,8,0,0);
		default:
			DE_ASSERT(false);
			return IVec4(0);
	}
}